

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_setpoint.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionPosition_setpoint::ArchiveIN
          (ChFunctionPosition_setpoint *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  eChSetpointMode_mapper mmapper;
  undefined **local_80;
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *local_78;
  undefined1 local_70;
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> local_68;
  eChSetpointMode_mapper local_48;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_setpoint>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  eChSetpointMode_mapper::eChSetpointMode_mapper(&local_48);
  eChSetpointMode_mapper::operator()(&local_68,&local_48,&this->mode);
  local_80 = (undefined **)0x9918dc;
  local_70 = 0;
  local_78 = &local_68;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_80);
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6e980
  ;
  if (local_68.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78 = (ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *)&this->P;
  local_80 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa1c279;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_78 = (ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *)&this->P_ds;
  local_80 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa1336b;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_78 = (ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *)&this->P_dsds;
  local_80 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa13370;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_48.super_ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>.
  super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6e980;
  if (local_48.super_ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>.
               enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChFunctionPosition_setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_setpoint>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
	eChSetpointMode_mapper mmapper;
	marchive >> CHNVP(mmapper(mode), "mode");
    marchive >> CHNVP(P);
	marchive >> CHNVP(P_ds);
	marchive >> CHNVP(P_dsds);
}